

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_3,_3> * __thiscall
deqp::gles2::Functional::MatrixCaseUtils::matrixCompMult<float,3,3>
          (Matrix<float,_3,_3> *__return_storage_ptr__,MatrixCaseUtils *this,Matrix<float,_3,_3> *a,
          Matrix<float,_3,_3> *b)

{
  Vector<float,_3> *pVVar1;
  int r;
  Matrix<float,_3,_3> *pMVar2;
  long lVar3;
  Matrix<float,_3,_3> *retVal;
  float *pfVar4;
  int row;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  
  pMVar2 = __return_storage_ptr__;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[1] = 0.0;
  pVVar1[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  lVar3 = 0;
  lVar5 = 0;
  pfVar4 = (float *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)pfVar4 + lVar6) = uVar7;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x24);
    lVar5 = lVar5 + 1;
    pfVar4 = pfVar4 + 1;
    lVar3 = lVar3 + 0xc;
  } while (lVar5 != 3);
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)__return_storage_ptr__ + lVar5) =
           *(float *)(this + lVar5) * *(float *)((long)a + lVar5);
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x24);
    lVar3 = lVar3 + 1;
    this = this + 4;
    a = (Matrix<float,_3,_3> *)((long)a + 4);
    __return_storage_ptr__ = (Matrix<float,_3,_3> *)((long)__return_storage_ptr__ + 4);
  } while (lVar3 != 3);
  return pMVar2;
}

Assistant:

tcu::Matrix<T, Rows, Cols> matrixCompMult (const tcu::Matrix<T, Rows, Cols>& a, const tcu::Matrix<T, Rows, Cols>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a(r,c) * b(r, c);

	return retVal;
}